

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O0

string * toBinary_abi_cxx11_(string *__return_storage_ptr__,int num,int bits)

{
  allocator<char> local_61;
  undefined1 local_60 [23];
  char local_49;
  int local_48;
  int i;
  allocator_type local_31;
  undefined1 local_30 [8];
  vector<char,_std::allocator<char>_> digits;
  int bits_local;
  int num_local;
  
  digits.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = bits;
  digits.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = num;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)local_30,(long)bits,&local_31);
  std::allocator<char>::~allocator(&local_31);
  for (local_48 = 0;
      local_48 < (int)digits.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
      local_48 = local_48 + 1) {
    local_49 = (digits.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_1_ -
               (digits.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_1_ -
                (digits.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ >> 7) & 0xfeU
               )) + '0';
    std::vector<char,_std::allocator<char>_>::push_back
              ((vector<char,_std::allocator<char>_> *)local_30,&local_49);
    digits.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ =
         (int)digits.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ >> 1;
  }
  std::vector<char,_std::allocator<char>_>::rbegin
            ((vector<char,_std::allocator<char>_> *)(local_60 + 8));
  std::vector<char,_std::allocator<char>_>::rend((vector<char,_std::allocator<char>_> *)local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::
  string<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>,void>
            ((string *)__return_storage_ptr__,
             (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
              *)(local_60 + 8),
             (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
              *)local_60,&local_61);
  std::allocator<char>::~allocator(&local_61);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_30)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string toBinary(int num, int bits) {
    std::vector<char> digits(bits);
    for (int i = 0; i < bits; ++i) {
        digits.push_back(num % 2 + '0');
        num >>= 1;
    }
    return std::string(digits.rbegin(), digits.rend());
}